

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O2

void __thiscall BGParseWorkItem::~BGParseWorkItem(BGParseWorkItem *this)

{
  HANDLE hHeap;
  
  SysFreeString(this->path);
  if (this->complete != (Event *)0x0) {
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Event>
              (&Memory::HeapAllocator::Instance,this->complete);
  }
  if (this->bufferReturn != (byte *)0x0) {
    CoTaskMemFree(this->bufferReturn);
  }
  if (this->discarded == true) {
    hHeap = GetProcessHeap();
    HeapFree(hHeap,0,this->script);
  }
  CompileScriptException::~CompileScriptException(&this->cse);
  return;
}

Assistant:

BGParseWorkItem::~BGParseWorkItem()
{
    SysFreeString(this->path);
    if (this->complete != nullptr)
    {
        HeapDelete(this->complete);
    }

    if (this->bufferReturn != nullptr)
    {
        ::CoTaskMemFree(this->bufferReturn);
    }

    if (this->discarded)
    {
        // When this workitem has been discarded, this is the last reference
        // to the script source, so free it now during destruction.
        ::HeapFree(GetProcessHeap(), 0, (void*)this->script);
    }
}